

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall
Minisat::Int64Option::getNonDefaultString
          (Int64Option *this,int granularity,char *buffer,size_t size)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int64_t i;
  long lVar7;
  vector<long,_std::allocator<long>_> values;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  if (granularity == 0) {
    lVar7 = (this->range).begin;
    lVar4 = (this->range).end;
    if ((lVar4 - lVar7) - 2U < 0xf) {
      for (; lVar7 <= lVar4; lVar7 = lVar7 + 1) {
        if (lVar7 != this->defaultValue) {
          snprintf(buffer,size,"%ld",lVar7);
          sVar3 = strlen(buffer);
          size = ~sVar3 + size;
          lVar1 = (this->range).end;
          lVar4 = lVar7;
          if ((lVar7 != lVar1) && (lVar4 = lVar1, lVar7 + 1 != this->defaultValue)) {
            buffer[(int)sVar3] = ',';
            lVar4 = (long)((sVar3 << 0x20) + 0x100000000) >> 0x20;
            buffer[lVar4] = '\0';
            buffer = buffer + lVar4;
            lVar4 = (this->range).end;
          }
        }
      }
    }
    return;
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fillGranularityDomain(this,granularity,(vector<long,_std::allocator<long>_> *)&local_48);
  uVar6 = 0;
  do {
    uVar5 = uVar6;
    while( true ) {
      if ((ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar5) {
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
        return;
      }
      if (local_48._M_impl.super__Vector_impl_data._M_start[uVar5] != this->defaultValue) break;
      uVar5 = uVar5 + 1;
    }
    snprintf(buffer,size,"%ld");
    sVar3 = strlen(buffer);
    size = ~sVar3 + size;
    uVar6 = uVar5 + 1;
    if ((uVar6 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3)) &&
       (local_48._M_impl.super__Vector_impl_data._M_start[uVar5 + 1] != this->defaultValue)) {
      buffer[(int)sVar3] = ',';
      iVar2 = (int)sVar3 + 1;
      buffer[iVar2] = '\0';
      buffer = buffer + iVar2;
      uVar6 = uVar5 + 1;
    }
  } while( true );
}

Assistant:

virtual void getNonDefaultString(int granularity, char *buffer, size_t size)
    {
        if (granularity != 0) {
            std::vector<int64_t> values;
            fillGranularityDomain(granularity, values);
            for (size_t i = 0; i < values.size(); ++i) {
                if (values[i] == defaultValue) {
                    continue;
                }                                         // do not print default value
                snprintf(buffer, size, "%ld", values[i]); // convert value
                const int sl = strlen(buffer);
                size = size - strlen(buffer) - 1; // store new size
                if (i + 1 < values.size() && values[i + 1] != defaultValue) {
                    buffer[sl] = ',';           // set separator
                    buffer[sl + 1] = 0;         // indicate end of buffer
                    buffer = &(buffer[sl + 1]); // move start pointer accordingly (len is one more now)
                }
            }
        } else if (range.end - range.begin <= 16 && range.end - range.begin > 1) {
            for (int64_t i = range.begin; i <= range.end; ++i) {
                if (i == defaultValue) {
                    continue;
                }                                 // do not print default value
                snprintf(buffer, size, "%ld", i); // convert value
                const int sl = strlen(buffer);
                size = size - strlen(buffer) - 1; // store new size
                if (i != range.end && i + 1 != defaultValue) {
                    buffer[sl] = ',';           // set separator
                    buffer[sl + 1] = 0;         // indicate end of buffer
                    buffer = &(buffer[sl + 1]); // move start pointer accordingly (len is one more now)
                }
            }
        }
    }